

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall mario::EPoller::update(EPoller *this,int operation,Channel *channel)

{
  int iVar1;
  Writer *pWVar2;
  Writer local_a8;
  int local_30;
  undefined1 local_2c [4];
  int fd;
  epoll_event event;
  Channel *channel_local;
  EPoller *pEStack_10;
  int operation_local;
  EPoller *this_local;
  
  event.data = (epoll_data_t)channel;
  channel_local._4_4_ = operation;
  pEStack_10 = this;
  memset(local_2c,0,0xc);
  local_2c = (undefined1  [4])Channel::events((Channel *)event.data.ptr);
  _fd = event.data;
  local_30 = Channel::fd(event.data);
  iVar1 = epoll_ctl(this->_epollfd,channel_local._4_4_,local_30,(epoll_event *)local_2c);
  if (iVar1 < 0) {
    el::base::Writer::Writer
              (&local_a8,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EPoller.cpp"
               ,99,"void mario::EPoller::update(int, Channel *)",NormalLog,0);
    pWVar2 = el::base::Writer::construct(&local_a8,1,el::base::consts::kDefaultLoggerId);
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [16])"epoll_ctl op = ");
    pWVar2 = el::base::Writer::operator<<(pWVar2,(int *)((long)&channel_local + 4));
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [7])" fd = ");
    el::base::Writer::operator<<(pWVar2,&local_30);
    el::base::Writer::~Writer(&local_a8);
  }
  return;
}

Assistant:

void EPoller::update(int operation, Channel* channel) {
    struct epoll_event event;
    bzero(&event, sizeof(event));
    event.events = channel->events();
    event.data.ptr = channel;
    int fd = channel->fd();
    if (::epoll_ctl(_epollfd, operation, fd, &event) < 0) {
        LOG(FATAL) << "epoll_ctl op = " << operation << " fd = " << fd;
    }
}